

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBarrelShape.cpp
# Opt level: O3

void __thiscall chrono::ChBarrelShape::ArchiveOUT(ChBarrelShape *this,ChArchiveOut *marchive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChBarrelShape>(marchive);
  ChVisualShape::ArchiveOUT(&this->super_ChVisualShape,marchive);
  local_30 = &this->Hlow;
  local_38 = "Hlow";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->Hsup;
  local_38 = "Hsup";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->Rvert;
  local_38 = "Rvert";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->Rhor;
  local_38 = "Rhor";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->Roffset;
  local_38 = "Roffset";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  return;
}

Assistant:

void ChBarrelShape::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChBarrelShape>();
    // serialize parent class
    ChVisualShape::ArchiveOUT(marchive);
    // serialize all member data:
    marchive << CHNVP(Hlow);
	marchive << CHNVP(Hsup);
	marchive << CHNVP(Rvert);
	marchive << CHNVP(Rhor);
	marchive << CHNVP(Roffset);
}